

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter.c
# Opt level: O2

void xml_show_fail(TestReporter *reporter,char *file,int line,char *message,__va_list_tag *arguments
                  )

{
  xmlChar *pxVar1;
  
  xmlTextWriterStartElement(child_output_writer,"failure");
  pxVar1 = xml_secure_vprint(message,arguments);
  xmlTextWriterWriteAttribute(child_output_writer,"message",pxVar1);
  (*_xmlFree)(pxVar1);
  xmlTextWriterStartElement(child_output_writer,"location");
  pxVar1 = xmlEscapePropValue(file);
  xmlTextWriterWriteAttribute(child_output_writer,"file",pxVar1);
  (*_xmlFree)(pxVar1);
  xmlTextWriterWriteFormatAttribute(child_output_writer,"line","%d",line);
  xmlTextWriterEndElement(child_output_writer);
  xmlTextWriterEndElement(child_output_writer);
  xmlTextWriterFlush(child_output_writer);
  return;
}

Assistant:

static void xml_show_fail(TestReporter *reporter, const char *file, int line, const char *message, va_list arguments) {
    char buffer[1000];

    output = concat(output, indent(reporter));
    output = concat(output, "<failure message=\"");

    xml_concat_escaped_message(message, arguments);
    output = concat(output, "\">\n");
    output = concat(output, indent(reporter));

    snprintf(buffer, sizeof(buffer)/sizeof(buffer[0]),
             "\t<location file=\"%s\" line=\"%d\"/>\n", file, line);
    output = concat(output, buffer);
    output = concat(output, indent(reporter));
    output = concat(output, "</failure>\n");

    fseek(child_output_tmpfile,0,SEEK_SET);
    fputs(output, child_output_tmpfile);
}